

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::TermPass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,int depth)

{
  EncodedChar **p;
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  EncodedChar EVar4;
  OLECHAR OVar5;
  CharCount CVar6;
  CharCount CVar7;
  undefined4 *puVar8;
  EncodedChar *pEVar9;
  byte *pbVar10;
  HRESULT error;
  CharCount i;
  byte *pbVar11;
  long lVar12;
  
  ThreadContext::ProbeStackNoDispose
            (this->scriptContext->threadContext,0x6000,this->scriptContext,(PVOID)0x0);
  pbVar11 = this->next;
  pEVar9 = this->tempLocationOfSurrogatePair;
  p = &this->next;
  if (this->inputLim < pbVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ec52ed;
    *puVar8 = 0;
    pbVar11 = *p;
  }
  bVar1 = *pbVar11;
  if (0x3e < bVar1) {
    if (0x7a < bVar1) {
      if (bVar1 != 0x7b) {
        if (bVar1 == 0x7c) goto switchD_00ec46d8_caseD_29;
        if (bVar1 != 0x7d) goto switchD_00ec46d8_caseD_25;
        goto switchD_00ec45c0_caseD_5d;
      }
switchD_00ec46d8_caseD_2a:
      bVar3 = AtQuantifier(this);
      if (!bVar3) {
        pbVar11 = this->next;
        if (this->inputLim < pbVar11 + 1) goto LAB_00ec4939;
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_00ec4991:
        if ((char)*pbVar11 < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar3) goto LAB_00ec52ed;
          *puVar8 = 0;
          pbVar11 = *p;
        }
        goto LAB_00ec49de;
      }
      error = -0x7ff5ec66;
      goto LAB_00ec485a;
    }
    switch(bVar1) {
    case 0x5b:
      if (this->inputLim < pbVar11 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec52ed;
        *puVar8 = 0;
        pbVar11 = *p;
        if ((char)*pbVar11 < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar3) goto LAB_00ec52ed;
          *puVar8 = 0;
          pbVar11 = *p;
        }
      }
      this->next = pbVar11 + 1;
      this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
      this->codePointAtTempLocation = 0;
      this->tempLocationOfRange = pbVar11 + 1;
      CharacterClassPass0(this);
      this->tempLocationOfRange = (EncodedChar *)0x0;
      ECMust(this,']',-0x7ff5ec65);
      break;
    case 0x5c:
      if (this->inputLim < pbVar11 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec52ed;
        *puVar8 = 0;
        pbVar11 = *p;
        if ((char)*pbVar11 < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar3) goto LAB_00ec52ed;
          *puVar8 = 0;
          pbVar11 = *p;
        }
      }
      this->next = pbVar11 + 1;
      bVar3 = AtomEscapePass0(this);
      if (bVar3) {
        return;
      }
      break;
    case 0x5d:
switchD_00ec45c0_caseD_5d:
      pbVar10 = this->inputLim;
      if (pbVar10 <= pbVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x25d,"(!IsEOF())","!IsEOF()");
        if (!bVar3) goto LAB_00ec52ed;
        *puVar8 = 0;
        pbVar10 = this->inputLim;
      }
      UTF8EncodingPolicyBase<false>::ReadFull<true>
                (&this->super_UTF8EncodingPolicyBase<false>,p,pbVar10);
      break;
    case 0x5e:
      goto switchD_00ec45c0_caseD_5e;
    default:
      if (bVar1 != 0x3f) goto switchD_00ec46d8_caseD_25;
      goto switchD_00ec46d8_caseD_2a;
    }
    goto LAB_00ec49e4;
  }
  switch(bVar1) {
  case 0x24:
switchD_00ec45c0_caseD_5e:
    if (pbVar11 + 1 <= this->inputLim) {
LAB_00ec4786:
      *p = pbVar11 + 1;
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (bVar3) {
      *puVar8 = 0;
      pbVar11 = *p;
      if ((char)*pbVar11 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar3) goto LAB_00ec52ed;
        *puVar8 = 0;
        pbVar11 = *p;
      }
      goto LAB_00ec4786;
    }
    goto LAB_00ec52ed;
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2c:
  case 0x2d:
    goto switchD_00ec46d8_caseD_25;
  case 0x28:
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
    if (this->inputLim < pbVar11 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec52ed;
      *puVar8 = 0;
      pbVar11 = *p;
    }
    else {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    if ((char)*pbVar11 < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar3) goto LAB_00ec52ed;
      *puVar8 = 0;
      pbVar11 = *p;
    }
    pbVar11 = pbVar11 + 1;
    this->next = pbVar11;
    if (this->inputLim < pbVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec52ed;
      *puVar8 = 0;
      pbVar11 = *p;
    }
    if (*pbVar11 == 0x3f) {
      pbVar10 = this->inputLim;
      if (pbVar10 < pbVar11 + 2) {
        Fail(this,-0x7ff5ec67);
        pbVar10 = this->inputLim;
        pbVar11 = this->next;
      }
      if (pbVar10 < pbVar11 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec52ed;
        *puVar8 = 0;
        pbVar11 = *p;
      }
      if ((0x3d < (ulong)pbVar11[1]) ||
         ((0x2400000200000000U >> ((ulong)pbVar11[1] & 0x3f) & 1) == 0)) goto LAB_00ec51d2;
      if (this->inputLim < pbVar11 + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec52ed;
        *puVar8 = 0;
      }
      lVar12 = 0;
      do {
        if ((char)(*p)[lVar12] < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar3) goto LAB_00ec52ed;
          *puVar8 = 0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 2);
      *p = *p + 2;
    }
    else {
LAB_00ec51d2:
      this->numGroups = this->numGroups + 1;
    }
    DisjunctionPass0(this,depth + 1);
    ECMust(this,')',-0x7ff5ec64);
    goto LAB_00ec4a08;
  case 0x29:
switchD_00ec46d8_caseD_29:
    error = -0x7ff5ec67;
LAB_00ec485a:
    Fail(this,error);
    break;
  case 0x2a:
  case 0x2b:
    goto switchD_00ec46d8_caseD_2a;
  case 0x2e:
    if (this->inputLim < pbVar11 + 1) {
LAB_00ec4939:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec52ed;
      *puVar8 = 0;
      pbVar11 = *p;
      goto LAB_00ec4991;
    }
LAB_00ec49de:
    *p = pbVar11 + 1;
    break;
  default:
    if ((bVar1 == 0) && (this->inputLim <= pbVar11)) {
      Fail(this,-0x7ff5ec67);
      pbVar11 = this->next;
    }
switchD_00ec46d8_caseD_25:
    pbVar10 = this->inputLim;
    if (pbVar10 <= pbVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x25d,"(!IsEOF())","!IsEOF()");
      if (!bVar3) goto LAB_00ec52ed;
      *puVar8 = 0;
      pbVar10 = this->inputLim;
    }
    OVar5 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                      (&this->super_UTF8EncodingPolicyBase<false>,p,pbVar10);
    if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
      TrackIfSurrogatePair(this,(uint)(ushort)OVar5,pbVar11,*(int *)&this->next - (int)pbVar11);
    }
  }
LAB_00ec49e4:
  if ((pEVar9 != (EncodedChar *)0x0) && (this->tempLocationOfSurrogatePair != (EncodedChar *)0x0)) {
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
  }
LAB_00ec4a08:
  bVar3 = AtQuantifier(this);
  if (!bVar3) {
    return;
  }
  pbVar11 = this->next;
  if (this->inputLim < pbVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ec52ed;
    *puVar8 = 0;
    pbVar11 = *p;
  }
  bVar1 = *pbVar11;
  if (1 < bVar1 - 0x2a) {
    if (bVar1 == 0x7b) {
      if (this->inputLim < pbVar11 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec52ed;
        *puVar8 = 0;
        pbVar11 = *p;
        if ((char)*pbVar11 < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar3) goto LAB_00ec52ed;
          *puVar8 = 0;
          pbVar11 = *p;
        }
      }
      else {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      }
      this->next = pbVar11 + 1;
      CVar6 = RepeatCount(this);
      pEVar9 = this->next;
      if (this->inputLim < pEVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec52ed;
        *puVar8 = 0;
        pEVar9 = *p;
      }
      if (*pEVar9 == '}') {
        if (this->inputLim < pEVar9 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ec52ed;
          *puVar8 = 0;
          pEVar9 = *p;
          if ((char)*pEVar9 < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                               "!this->IsMultiUnitChar(next[i])");
            if (!bVar3) goto LAB_00ec52ed;
            *puVar8 = 0;
            pEVar9 = *p;
          }
        }
        this->next = pEVar9 + 1;
        goto LAB_00ec4b51;
      }
      if (*pEVar9 == ',') {
        if (this->inputLim < pEVar9 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ec52ed;
          *puVar8 = 0;
          pEVar9 = *p;
          if ((char)*pEVar9 < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                               "!this->IsMultiUnitChar(next[i])");
            if (!bVar3) goto LAB_00ec52ed;
            *puVar8 = 0;
            pEVar9 = *p;
          }
        }
        pEVar9 = pEVar9 + 1;
        this->next = pEVar9;
        if (this->inputLim < pEVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ec52ed;
          *puVar8 = 0;
          pEVar9 = *p;
        }
        if (*pEVar9 != '}') {
          CVar7 = RepeatCount(this);
          if (CVar7 < CVar6) {
            Fail(this,-0x7ff5ec67);
          }
          EVar4 = ECLookahead(this,0);
          if (EVar4 != '}') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x50e,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
            if (!bVar3) goto LAB_00ec52ed;
            *puVar8 = 0;
          }
        }
        ECConsume(this,1);
        goto LAB_00ec4b51;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x518,"(false)","false");
      if (bVar3) {
        *puVar8 = 0;
        return;
      }
      goto LAB_00ec52ed;
    }
    if (bVar1 != 0x3f) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x51e,"(false)","false");
      if (bVar3) {
        *puVar8 = 0;
        return;
      }
      goto LAB_00ec52ed;
    }
  }
  if (this->inputLim < pbVar11 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) {
LAB_00ec52ed:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
    pbVar11 = *p;
    if ((char)*pbVar11 < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar3) goto LAB_00ec52ed;
      *puVar8 = 0;
      pbVar11 = *p;
    }
  }
  this->next = pbVar11 + 1;
LAB_00ec4b51:
  OptNonGreedy(this);
  return;
}

Assistant:

void Parser<P, IsLiteral>::TermPass0(int depth)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);
        // Either we have a location at the start, or the end, never both. As in between it should have been cleared if surrogate pair
        // Or must be cleared if we didn't perform the check
        bool clearLocationIfPresent = this->tempLocationOfSurrogatePair != nullptr;

        switch (ECLookahead())
        {
        case '^':
        case '$':
            ECConsume();
            return;
        case '\\':
            ECConsume();
            if (AtomEscapePass0())
                return;
            break;
        case '(':
            // Can't combine into a single codeunit because of group present
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            clearLocationIfPresent = false;
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                if (!ECCanConsume(2))
                    Fail(JSERR_RegExpSyntax);
                switch (ECLookahead(1))
                {
                case '=':
                case '!':
                case ':':
                    ECConsume(2);
                    break;
                default:
                    numGroups++;
                    break;
                }
                break;
            default:
                numGroups++;
                break;
            }
            DisjunctionPass0(depth + 1);
            ECMust(')', JSERR_RegExpNoParen);
            break;
        case '.':
            ECConsume();
            break;
        case '[':
            ECConsume();
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            this->tempLocationOfRange = next;
            CharacterClassPass0();
            this->tempLocationOfRange = nullptr;
            ECMust(']', JSERR_RegExpNoBracket);
            break;
        case ')':
        case '|':
            Fail(JSERR_RegExpSyntax);
            break;
        case ']':
        case '}':
            NextChar();
            break;
        case '*':
        case '+':
        case '?':
        case '{':
            if (AtQuantifier())
                Fail(JSERR_RegExpBadQuant);
            else
                ECConsume();
            break;
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            {
                const EncodedChar* current = next;
                Char c = NextChar();
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(c, current, (uint32)(next - current));
                }
                // Closing '/' in literals should be caught explicitly
                Assert(!IsLiteral || c != '/');
            }
            break;
        }

        if (clearLocationIfPresent && this->tempLocationOfSurrogatePair != nullptr)
        {
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
        }

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
            case '+':
            case '?':
                ECConsume();
                OptNonGreedy();
                break;
            case '{':
                {
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            OptNonGreedy();
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            if (upper < lower)
                                Fail(JSERR_RegExpSyntax);
                            Assert(ECLookahead() == '}');
                            ECConsume();
                            OptNonGreedy();
                        }
                        break;
                    case '}':
                        ECConsume();
                        OptNonGreedy();
                        break;
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }
    }